

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitYield(RegSlot resultReg,RegSlot inputReg,ByteCodeGenerator *byteCodeGenerator,
              FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  RegSlot resultReg_00;
  ByteCodeLabel resumeNormalLabel;
  ByteCodeLabel resumeThrowLabel;
  
  this = &byteCodeGenerator->m_writer;
  resultReg_00 = funcInfo->yieldRegister;
  EmitCreateYieldResult(resultReg_00,inputReg,byteCodeGenerator,funcInfo);
  resumeNormalLabel = Js::ByteCodeWriter::DefineLabel(this);
  resumeThrowLabel = Js::ByteCodeWriter::DefineLabel(this);
  EmitYieldAndResume(resultReg,resultReg_00,resumeNormalLabel,resumeThrowLabel,byteCodeGenerator,
                     funcInfo);
  EmitReturnFromYield(resultReg,byteCodeGenerator,funcInfo);
  Js::ByteCodeWriter::MarkLabel(this,resumeThrowLabel);
  Js::ByteCodeWriter::Reg1(this,Throw,resultReg);
  Js::ByteCodeWriter::MarkLabel(this,resumeNormalLabel);
  return;
}

Assistant:

void EmitYield(
    Js::RegSlot resultReg,
    Js::RegSlot inputReg,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    auto* writer = byteCodeGenerator->Writer();
    Js::RegSlot yieldReg = funcInfo->yieldRegister;

    EmitCreateYieldResult(yieldReg, inputReg, byteCodeGenerator, funcInfo);

    Js::ByteCodeLabel resumeNormal = writer->DefineLabel();
    Js::ByteCodeLabel resumeThrow = writer->DefineLabel();

    EmitYieldAndResume(
        resultReg,
        yieldReg,
        resumeNormal,
        resumeThrow,
        byteCodeGenerator,
        funcInfo);

    // Return case: set the return register value and branch to function exit
    EmitReturnFromYield(resultReg, byteCodeGenerator, funcInfo);

    // Throw case: throw the resume value
    writer->MarkLabel(resumeThrow);
    writer->Reg1(Js::OpCode::Throw, resultReg);

    // Normal case: continue (value is already in result register)
    writer->MarkLabel(resumeNormal);
}